

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minpack.cc
# Opt level: O0

bool gmath::slmdif(lmdifFct fct,int m,int n,double *x,double *fvec,void *up,double tol,double step,
                  long *ltmp,double *dtmp)

{
  doublereal *ftol_00;
  S_fp in_RCX;
  int in_EDX;
  doublereal *unaff_RBP;
  int in_ESI;
  integer *in_R8;
  integer *in_R9;
  doublereal *unaff_R13;
  doublereal *unaff_R14;
  integer *unaff_R15;
  doublereal *in_XMM0_Qa;
  doublereal *in_XMM1_Qa;
  doublereal *unaff_retaddr;
  integer *in_stack_00000008;
  doublereal *in_stack_00000010;
  integer *in_stack_00000018;
  integer *in_stack_00000020;
  integer *in_stack_00000028;
  doublereal *in_stack_00000030;
  integer *in_stack_00000038;
  integer *in_stack_00000040;
  doublereal *in_stack_00000048;
  doublereal *in_stack_00000050;
  doublereal *in_stack_00000058;
  doublereal *in_stack_00000060;
  doublereal *in_stack_00000068;
  void *in_stack_00000070;
  double *adtmp;
  long *altmp;
  integer ldfjacl;
  integer nfevl;
  integer info;
  integer nprint;
  doublereal factor;
  integer model;
  doublereal epsfct;
  integer maxfevl;
  doublereal gtol;
  doublereal xtol;
  doublereal ftol;
  integer np;
  integer mp;
  undefined8 local_e0;
  undefined8 local_d8;
  
  ftol_00 = (doublereal *)(long)in_ESI;
  local_d8 = (integer *)0x0;
  local_e0 = (doublereal *)0x0;
  if (in_stack_00000008 == (integer *)0x0) {
    in_stack_00000008 = (integer *)calloc((long)in_EDX,8);
    local_d8 = in_stack_00000008;
  }
  if (in_stack_00000010 == (doublereal *)0x0) {
    in_stack_00000010 = (doublereal *)calloc((long)(in_EDX * 5 + in_ESI * in_EDX + in_ESI),8);
    local_e0 = in_stack_00000010;
  }
  lmdif_cvkit(in_RCX,in_R8,in_R9,in_XMM0_Qa,in_XMM1_Qa,ftol_00,unaff_R13,unaff_R14,unaff_R15,
              unaff_RBP,unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
              in_stack_00000020,in_stack_00000028,in_stack_00000030,in_stack_00000038,
              in_stack_00000040,in_stack_00000048,in_stack_00000050,in_stack_00000058,
              in_stack_00000060,in_stack_00000068,in_stack_00000070);
  free(local_d8);
  free(local_e0);
  return true;
}

Assistant:

bool slmdif(lmdifFct fct, int m, int n, double x[], double fvec[], void *up,
            double tol, double step, long ltmp[], double dtmp[])
{
  integer    mp=static_cast<integer>(m);
  integer    np=static_cast<integer>(n);
  doublereal ftol=tol, xtol=tol, gtol=0;
  integer    maxfevl=static_cast<integer>(200*(n+1));
  doublereal epsfct=step;
  integer    model=1;
  doublereal factor=100;
  integer    nprint=-1;
  integer    info=0;
  integer    nfevl=0;
  integer    ldfjacl=(integer) m;

  long       *altmp=0;
  double     *adtmp=0;

  if (ltmp == 0)
  {
    ltmp=altmp=static_cast<long *>(calloc(n, sizeof(long)));
  }

  if (dtmp == 0)
  {
    dtmp=adtmp=static_cast<double *>(calloc(5*n+m*n+m, sizeof(double)));
  }

  lmdif_cvkit(reinterpret_cast<S_fp>(fct), &mp, &np, x, fvec, &ftol, &xtol, &gtol, &maxfevl, &epsfct,
              dtmp, &model, &factor, &nprint, &info, &nfevl, dtmp+n, &ldfjacl, ltmp,
              dtmp+n+m*n, dtmp+2*n+n*m, dtmp+3*n+n*m, dtmp+4*n+n*m, dtmp+5*n+n*m, up);

  free(altmp);
  free(adtmp);

  assert(info >= 1);

  return info <= 4;
}